

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bit_test.c
# Opt level: O0

void proc_bit_ops(MppWriteCtx *writer,BitOps *ops)

{
  BitOps *ops_local;
  MppWriteCtx *writer_local;
  
  switch(ops->type) {
  case BIT_PUT_NO03:
    mpp_writer_put_raw_bits(writer,ops->val,ops->len);
    break;
  case BIT_PUT:
    mpp_writer_put_bits(writer,ops->val,ops->len);
    break;
  case BIT_PUT_UE:
    mpp_writer_put_ue(writer,ops->val);
    break;
  case BIT_PUT_SE:
    mpp_writer_put_ue(writer,ops->val);
    break;
  case BIT_ALIGN_BYTE:
    mpp_writer_trailing(writer);
    break;
  default:
    _mpp_log_l(2,"mpp_bit_test","invalid ops type %d\n",0,ops->type);
  }
  return;
}

Assistant:

void proc_bit_ops(MppWriteCtx *writer, BitOps *ops)
{
    switch (ops->type) {
    case BIT_PUT_NO03 : {
        mpp_writer_put_raw_bits(writer, ops->val, ops->len);
    } break;
    case BIT_PUT : {
        mpp_writer_put_bits(writer, ops->val, ops->len);
    } break;
    case BIT_PUT_UE : {
        mpp_writer_put_ue(writer, ops->val);
    } break;
    case BIT_PUT_SE : {
        mpp_writer_put_ue(writer, ops->val);
    } break;
    case BIT_ALIGN_BYTE : {
        mpp_writer_trailing(writer);
    } break;
    default : {
        mpp_err("invalid ops type %d\n", ops->type);
    } break;
    }
}